

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::SetEnumerable
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyId propertyId,BOOL value)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  bool local_3a;
  bool local_39;
  int local_2c;
  BOOL local_28;
  BOOL isNumericPropertyId;
  BOOL value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  local_28 = value;
  isNumericPropertyId = propertyId;
  _value_local = instance;
  instance_local = (DynamicObject *)this;
  if (propertyId == 0xd1) {
    if (value != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/ES5ArrayTypeHandler.cpp"
                                  ,0x485,"(!value)","!value");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local._4_4_ = 1;
  }
  else {
    BVar3 = UpdateAttribute(this,instance,propertyId,'\x01',value,&local_2c);
    local_39 = true;
    if (BVar3 == 0) {
      local_3a = false;
      if (local_2c == 0) {
        BVar3 = DictionaryTypeHandlerBase<unsigned_short>::SetEnumerable
                          (&this->super_DictionaryTypeHandlerBase<unsigned_short>,_value_local,
                           isNumericPropertyId,local_28);
        local_3a = BVar3 != 0;
      }
      local_39 = local_3a;
    }
    this_local._4_4_ = (uint)local_39;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::SetEnumerable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        if (propertyId == PropertyIds::length)
        {
            Assert(!value); // Can only set enumerable to false
            return true;
        }

        BOOL isNumericPropertyId;
        return UpdateAttribute(instance, propertyId, PropertyEnumerable, value, isNumericPropertyId)
            || (!isNumericPropertyId && __super::SetEnumerable(instance, propertyId, value));
    }